

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  uint64_t uVar365;
  uint64_t uVar366;
  uint64_t uVar367;
  ulong uVar368;
  ulong uVar369;
  ulong uVar370;
  ulong uVar371;
  ulong uVar372;
  ulong uVar373;
  ulong uVar374;
  ulong uVar375;
  ulong uVar376;
  ulong uVar377;
  ulong uVar378;
  ulong uVar379;
  ulong uVar380;
  ulong uVar381;
  ulong uVar382;
  ulong uVar383;
  ulong uVar384;
  ulong uVar385;
  long lVar386;
  ulong uVar387;
  ulong uVar388;
  uint64_t tmp1;
  uint64_t tmp3_1;
  uint64_t tmp3_2;
  uint64_t tmp3_3;
  uint64_t tmp3;
  uint64_t tmp2;
  
  r->infinity = a->infinity;
  psVar1 = &a->y;
  uVar372 = (a->z).n[0];
  uVar383 = (a->z).n[1];
  uVar373 = (a->z).n[2];
  uVar374 = (a->z).n[3];
  uVar375 = (a->z).n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = psVar1->n[0];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar374;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (a->y).n[1];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar373;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (a->y).n[2];
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar383;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (a->y).n[3];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar372;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (a->y).n[4];
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar375;
  uVar368 = SUB168(auVar8 * auVar178,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar368 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar175 + auVar4 * auVar174 + auVar6 * auVar176 + auVar7 * auVar177 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar370 = auVar4._0_8_;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar370 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = psVar1->n[0];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar375;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (a->y).n[1];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar374;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (a->y).n[2];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar373;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (a->y).n[3];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar383;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (a->y).n[4];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar372;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar368 >> 0x34 | SUB168(auVar8 * auVar178,8) << 0xc;
  auVar4 = auVar10 * auVar179 + auVar316 + auVar11 * auVar180 + auVar12 * auVar181 +
           auVar13 * auVar182 + auVar14 * auVar183 + auVar15 * ZEXT816(0x1000003d10);
  uVar368 = auVar4._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = psVar1->n[0];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar372;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (a->y).n[1];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar375;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (a->y).n[2];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar374;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (a->y).n[3];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar373;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (a->y).n[4];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar383;
  auVar4 = auVar17 * auVar185 + auVar317 + auVar18 * auVar186 + auVar19 * auVar187 +
           auVar20 * auVar188;
  uVar371 = auVar4._0_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = (uVar371 & 0xfffffffffffff) << 4 | (uVar368 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar16 * auVar184 + ZEXT816(0x1000003d1) * auVar189;
  uVar371 = auVar4._0_8_;
  (r->z).n[0] = uVar371 & 0xfffffffffffff;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = psVar1->n[0];
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar383;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (a->y).n[1];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar372;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (a->y).n[2];
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar375;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (a->y).n[3];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar374;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (a->y).n[4];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar373;
  auVar5 = auVar23 * auVar192 + auVar319 + auVar24 * auVar193 + auVar25 * auVar194;
  uVar371 = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar371 & 0xfffffffffffff;
  auVar4 = auVar21 * auVar190 + auVar318 + auVar22 * auVar191 + auVar26 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar371 >> 0x34 | auVar5._8_8_ << 0xc;
  (r->z).n[1] = uVar382 & 0xfffffffffffff;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = psVar1->n[0];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar373;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (a->y).n[1];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar383;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (a->y).n[2];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar372;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (a->y).n[3];
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar375;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (a->y).n[4];
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar374;
  auVar5 = auVar30 * auVar198 + auVar321 + auVar31 * auVar199;
  uVar372 = auVar5._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar27 * auVar195 + auVar320 + auVar28 * auVar196 + auVar29 * auVar197 +
           auVar32 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  (r->z).n[2] = uVar383 & 0xfffffffffffff;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar370 & 0xfffffffffffff);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar372 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar322 = auVar33 * ZEXT816(0x1000003d10) + auVar322;
  uVar372 = auVar322._0_8_;
  (r->z).n[3] = uVar372 & 0xfffffffffffff;
  (r->z).n[4] = (uVar372 >> 0x34 | auVar322._8_8_ << 0xc) + (uVar368 & 0xffffffffffff);
  uVar372 = psVar1->n[0];
  uVar383 = (a->y).n[1];
  uVar373 = (a->y).n[2];
  uVar374 = (a->y).n[3];
  uVar375 = (a->y).n[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar372 * 2;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar374;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar383 * 2;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar373;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar375;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar375;
  uVar368 = SUB168(auVar36 * auVar202,0);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar368 & 0xfffffffffffff;
  auVar4 = auVar35 * auVar201 + auVar34 * auVar200 + auVar37 * ZEXT816(0x1000003d10);
  uVar376 = auVar4._0_8_;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar376 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar375 = uVar375 * 2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar372;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar375;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar383 * 2;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar374;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar373;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar373;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar368 >> 0x34 | SUB168(auVar36 * auVar202,8) << 0xc;
  auVar4 = auVar38 * auVar203 + auVar323 + auVar39 * auVar204 + auVar40 * auVar205 +
           auVar41 * ZEXT816(0x1000003d10);
  uVar368 = auVar4._0_8_;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar372;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar372;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar383;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar375;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar373 * 2;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar374;
  auVar4 = auVar43 * auVar207 + auVar324 + auVar44 * auVar208;
  uVar370 = auVar4._0_8_;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar370 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = (uVar370 & 0xfffffffffffff) << 4 | (uVar368 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar42 * auVar206 + ZEXT816(0x1000003d1) * auVar209;
  uVar371 = auVar4._0_8_;
  uVar370 = uVar371 & 0xfffffffffffff;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar372 * 2;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar383;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar373;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar375;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar374;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar374;
  auVar5 = auVar46 * auVar211 + auVar326 + auVar47 * auVar212;
  uVar371 = auVar5._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar371 & 0xfffffffffffff;
  auVar4 = auVar45 * auVar210 + auVar325 + auVar48 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar371 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar371 = uVar382 & 0xfffffffffffff;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar372 * 2;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar373;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar383;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar383;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar374;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar375;
  auVar328 = auVar51 * auVar215 + auVar328;
  uVar372 = auVar328._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar49 * auVar213 + auVar327 + auVar50 * auVar214 + auVar52 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  uVar382 = uVar383 & 0xfffffffffffff;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar376 & 0xfffffffffffff);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar372 >> 0x34 | auVar328._8_8_ << 0xc;
  auVar329 = auVar53 * ZEXT816(0x1000003d10) + auVar329;
  uVar372 = auVar329._0_8_;
  uVar376 = uVar372 & 0xfffffffffffff;
  uVar368 = (uVar372 >> 0x34 | auVar329._8_8_ << 0xc) + (uVar368 & 0xffffffffffff);
  uVar372 = (a->x).n[0];
  uVar383 = (a->x).n[1];
  uVar373 = (a->x).n[2];
  uVar374 = (a->x).n[3];
  uVar375 = (a->x).n[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar372 * 2;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar374;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar383 * 2;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar373;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar375;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar375;
  uVar369 = SUB168(auVar56 * auVar218,0);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar369 & 0xfffffffffffff;
  auVar4 = auVar55 * auVar217 + auVar54 * auVar216 + auVar57 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar375 = uVar375 * 2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar372;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar375;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar383 * 2;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar374;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar373;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar373;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar369 >> 0x34 | SUB168(auVar56 * auVar218,8) << 0xc;
  auVar4 = auVar58 * auVar219 + auVar330 + auVar59 * auVar220 + auVar60 * auVar221 +
           auVar61 * ZEXT816(0x1000003d10);
  uVar369 = auVar4._0_8_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar369 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar372;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar372;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar383;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar375;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar373 * 2;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar374;
  auVar4 = auVar63 * auVar223 + auVar331 + auVar64 * auVar224;
  uVar378 = auVar4._0_8_;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar378 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = (uVar378 & 0xfffffffffffff) << 4 | (uVar369 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar62 * auVar222 + ZEXT816(0x1000003d1) * auVar225;
  uVar384 = auVar4._0_8_;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar384 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar372 * 2;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar383;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar373;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar375;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar374;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar374;
  auVar5 = auVar66 * auVar227 + auVar333 + auVar67 * auVar228;
  uVar378 = auVar5._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar378 & 0xfffffffffffff;
  auVar4 = auVar65 * auVar226 + auVar332 + auVar68 * ZEXT816(0x1000003d10);
  uVar385 = auVar4._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar378 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar372 * 2;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar373;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar383;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar383;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar374;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar375;
  auVar335 = auVar71 * auVar231 + auVar335;
  uVar372 = auVar335._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar69 * auVar229 + auVar334 + auVar70 * auVar230 + auVar72 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar377 & 0xfffffffffffff);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar372 >> 0x34 | auVar335._8_8_ << 0xc;
  auVar336 = auVar73 * ZEXT816(0x1000003d10) + auVar336;
  uVar378 = auVar336._0_8_;
  lVar386 = (uVar384 & 0xfffffffffffff) * 3;
  uVar372 = -(ulong)((uint)lVar386 & 1);
  uVar373 = uVar372 >> 0xc;
  uVar377 = (uVar385 & 0xfffffffffffff) * 3 + uVar373;
  uVar375 = (uVar383 & 0xfffffffffffff) * 3 + uVar373;
  uVar374 = uVar373 + (uVar378 & 0xfffffffffffff) * 3;
  uVar383 = (uVar372 >> 0x10) +
            ((uVar378 >> 0x34 | auVar336._8_8_ << 0xc) + (uVar369 & 0xffffffffffff)) * 3;
  uVar380 = ((ulong)((uint)uVar377 & 1) << 0x33) + ((uVar373 & 0xffffefffffc2f) + lVar386 >> 1);
  uVar381 = ((ulong)((uint)uVar375 & 1) << 0x33) + (uVar377 >> 1);
  uVar379 = ((ulong)((uint)uVar374 & 1) << 0x33) + (uVar375 >> 1);
  uVar378 = ((ulong)((uint)uVar383 & 1) << 0x33) + (uVar374 >> 1);
  uVar383 = uVar383 >> 1;
  uVar384 = 0x3ffffbfffff0bc - uVar370;
  uVar385 = 0x3ffffffffffffc - uVar371;
  uVar387 = 0x3ffffffffffffc - uVar382;
  uVar388 = 0x3ffffffffffffc - uVar376;
  uVar372 = 0x3fffffffffffc - uVar368;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = (a->x).n[0];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar388;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = (a->x).n[1];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar387;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = (a->x).n[2];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar385;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = (a->x).n[3];
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar384;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = (a->x).n[4];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar372;
  uVar373 = SUB168(auVar78 * auVar236,0);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar373 & 0xfffffffffffff;
  auVar4 = auVar75 * auVar233 + auVar74 * auVar232 + auVar76 * auVar234 + auVar77 * auVar235 +
           auVar79 * ZEXT816(0x1000003d10);
  uVar369 = auVar4._0_8_;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar369 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = (a->x).n[0];
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar372;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = (a->x).n[1];
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar388;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = (a->x).n[2];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar387;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (a->x).n[3];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar385;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = (a->x).n[4];
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar384;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar373 >> 0x34 | SUB168(auVar78 * auVar236,8) << 0xc;
  auVar4 = auVar80 * auVar237 + auVar337 + auVar81 * auVar238 + auVar82 * auVar239 +
           auVar83 * auVar240 + auVar84 * auVar241 + auVar85 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = (a->x).n[0];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar384;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = (a->x).n[1];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar372;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = (a->x).n[2];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar388;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (a->x).n[3];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar387;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (a->x).n[4];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar385;
  auVar4 = auVar87 * auVar243 + auVar338 + auVar88 * auVar244 + auVar89 * auVar245 +
           auVar90 * auVar246;
  uVar373 = auVar4._0_8_;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar373 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = (uVar373 & 0xfffffffffffff) << 4 | (uVar377 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar86 * auVar242 + ZEXT816(0x1000003d1) * auVar247;
  uVar374 = auVar4._0_8_;
  uVar373 = uVar374 & 0xfffffffffffff;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar374 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (a->x).n[0];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar385;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = (a->x).n[1];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar384;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = (a->x).n[2];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar372;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = (a->x).n[3];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar388;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (a->x).n[4];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar387;
  auVar5 = auVar93 * auVar250 + auVar340 + auVar94 * auVar251 + auVar95 * auVar252;
  uVar374 = auVar5._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar374 & 0xfffffffffffff;
  auVar4 = auVar91 * auVar248 + auVar339 + auVar92 * auVar249 + auVar96 * ZEXT816(0x1000003d10);
  uVar375 = auVar4._0_8_;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar374 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar374 = uVar375 & 0xfffffffffffff;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar375 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = (a->x).n[0];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar387;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (a->x).n[1];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar385;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = (a->x).n[2];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar384;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (a->x).n[3];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar372;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (a->x).n[4];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar388;
  auVar5 = auVar100 * auVar256 + auVar342 + auVar101 * auVar257;
  uVar372 = auVar5._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar97 * auVar253 + auVar341 + auVar98 * auVar254 + auVar99 * auVar255 +
           auVar102 * ZEXT816(0x1000003d10);
  uVar384 = auVar4._0_8_;
  uVar375 = uVar384 & 0xfffffffffffff;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = (uVar384 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar369 & 0xfffffffffffff);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar372 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar343 = auVar103 * ZEXT816(0x1000003d10) + auVar343;
  uVar372 = auVar343._0_8_;
  uVar369 = uVar372 & 0xfffffffffffff;
  lVar386 = (uVar372 >> 0x34 | auVar343._8_8_ << 0xc) + (uVar377 & 0xffffffffffff);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar380 * 2;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar378;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar381 * 2;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar379;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar383;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar383;
  uVar377 = SUB168(auVar106 * auVar260,0);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar377 & 0xfffffffffffff;
  auVar4 = auVar105 * auVar259 + auVar104 * auVar258 + auVar107 * ZEXT816(0x1000003d10);
  uVar384 = auVar4._0_8_;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar384 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar372 = uVar383 * 2;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar380;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar372;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar381 * 2;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar378;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar379;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar379;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar377 >> 0x34 | SUB168(auVar106 * auVar260,8) << 0xc;
  auVar4 = auVar108 * auVar261 + auVar344 + auVar109 * auVar262 + auVar110 * auVar263 +
           auVar111 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar380;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar380;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar381;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar372;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar379 * 2;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar378;
  auVar4 = auVar113 * auVar265 + auVar345 + auVar114 * auVar266;
  uVar385 = auVar4._0_8_;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = (uVar385 & 0xfffffffffffff) << 4 | (uVar377 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar112 * auVar264 + ZEXT816(0x1000003d1) * auVar267;
  uVar385 = auVar4._0_8_;
  (r->x).n[0] = uVar385 & 0xfffffffffffff;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar380 * 2;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar381;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar379;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar372;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar378;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar378;
  auVar5 = auVar116 * auVar269 + auVar347 + auVar117 * auVar270;
  uVar385 = auVar5._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar385 & 0xfffffffffffff;
  auVar4 = auVar115 * auVar268 + auVar346 + auVar118 * ZEXT816(0x1000003d10);
  uVar387 = auVar4._0_8_;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar385 >> 0x34 | auVar5._8_8_ << 0xc;
  (r->x).n[1] = uVar387 & 0xfffffffffffff;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar387 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar380 * 2;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar379;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar381;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar381;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar378;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar372;
  auVar349 = auVar121 * auVar273 + auVar349;
  uVar372 = auVar349._0_8_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar119 * auVar271 + auVar348 + auVar120 * auVar272 + auVar122 * ZEXT816(0x1000003d10);
  uVar385 = auVar4._0_8_;
  (r->x).n[2] = uVar385 & 0xfffffffffffff;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = (uVar385 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar384 & 0xfffffffffffff);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar372 >> 0x34 | auVar349._8_8_ << 0xc;
  auVar350 = auVar123 * ZEXT816(0x1000003d10) + auVar350;
  uVar372 = auVar350._0_8_;
  (r->x).n[3] = uVar372 & 0xfffffffffffff;
  (r->x).n[4] = (uVar372 >> 0x34 | auVar350._8_8_ << 0xc) + (uVar377 & 0xffffffffffff);
  uVar3 = (r->x).n[1];
  uVar365 = (r->x).n[2];
  uVar366 = (r->x).n[3];
  (r->x).n[0] = (r->x).n[0] + uVar373 * 2;
  (r->x).n[1] = uVar3 + uVar374 * 2;
  (r->x).n[2] = uVar375 * 2 + uVar365;
  (r->x).n[3] = uVar369 * 2 + uVar366;
  puVar2 = (r->x).n + 4;
  *puVar2 = *puVar2 + lVar386 * 2;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar370 * 2;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar376;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar371 * 2;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar382;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar368;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar368;
  uVar372 = SUB168(auVar126 * auVar276,0);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar125 * auVar275 + auVar124 * auVar274 + auVar127 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar368 = uVar368 * 2;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar370;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar368;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar371 * 2;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar376;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar382;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar382;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar372 >> 0x34 | SUB168(auVar126 * auVar276,8) << 0xc;
  auVar4 = auVar128 * auVar277 + auVar351 + auVar129 * auVar278 + auVar130 * auVar279 +
           auVar131 * ZEXT816(0x1000003d10);
  uVar384 = auVar4._0_8_;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar384 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar370;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar370;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar371;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar368;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar382 * 2;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar376;
  auVar4 = auVar133 * auVar281 + auVar352 + auVar134 * auVar282;
  uVar372 = auVar4._0_8_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar372 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = (uVar372 & 0xfffffffffffff) << 4 | (uVar384 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar132 * auVar280 + ZEXT816(0x1000003d1) * auVar283;
  uVar385 = auVar4._0_8_;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar370 * 2;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar371;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar382;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar368;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar376;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar376;
  auVar5 = auVar136 * auVar285 + auVar354 + auVar137 * auVar286;
  uVar372 = auVar5._0_8_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar135 * auVar284 + auVar353 + auVar138 * ZEXT816(0x1000003d10);
  uVar387 = auVar4._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar372 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar387 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar370 * 2;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar382;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar371;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar371;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar376;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar368;
  auVar356 = auVar141 * auVar289 + auVar356;
  uVar372 = auVar356._0_8_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar139 * auVar287 + auVar355 + auVar140 * auVar288 + auVar142 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = (uVar382 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar377 & 0xfffffffffffff);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar372 >> 0x34 | auVar356._8_8_ << 0xc;
  auVar357 = auVar143 * ZEXT816(0x1000003d10) + auVar357;
  uVar376 = auVar357._0_8_;
  uVar373 = (r->x).n[0] + uVar373;
  uVar374 = (r->x).n[1] + uVar374;
  uVar375 = (r->x).n[2] + uVar375;
  uVar369 = (r->x).n[3] + uVar369;
  uVar372 = lVar386 + (r->x).n[4];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar380;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar369;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar381;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar375;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar379;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar374;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar378;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar373;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar383;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar372;
  uVar368 = SUB168(auVar148 * auVar294,0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar368 & 0xfffffffffffff;
  auVar4 = auVar145 * auVar291 + auVar144 * auVar290 + auVar146 * auVar292 + auVar147 * auVar293 +
           auVar149 * ZEXT816(0x1000003d10);
  uVar370 = auVar4._0_8_;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar370 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar380;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar372;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar381;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar369;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar379;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar375;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar378;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar374;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar383;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar373;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar368 >> 0x34 | SUB168(auVar148 * auVar294,8) << 0xc;
  auVar4 = auVar150 * auVar295 + auVar358 + auVar151 * auVar296 + auVar152 * auVar297 +
           auVar153 * auVar298 + auVar154 * auVar299 + auVar155 * ZEXT816(0x1000003d10);
  uVar368 = auVar4._0_8_;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar380;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar373;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar381;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar372;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar379;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar369;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar378;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar375;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar383;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar374;
  auVar4 = auVar157 * auVar301 + auVar359 + auVar158 * auVar302 + auVar159 * auVar303 +
           auVar160 * auVar304;
  uVar371 = auVar4._0_8_;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = (uVar371 & 0xfffffffffffff) << 4 | (uVar368 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar156 * auVar300 + ZEXT816(0x1000003d1) * auVar305;
  uVar371 = auVar4._0_8_;
  (r->y).n[0] = uVar371 & 0xfffffffffffff;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar371 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar380;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar374;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar381;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar373;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar379;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar372;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar378;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar369;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar383;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar375;
  auVar5 = auVar163 * auVar308 + auVar361 + auVar164 * auVar309 + auVar165 * auVar310;
  uVar371 = auVar5._0_8_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar371 & 0xfffffffffffff;
  auVar4 = auVar161 * auVar306 + auVar360 + auVar162 * auVar307 + auVar166 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar371 >> 0x34 | auVar5._8_8_ << 0xc;
  (r->y).n[1] = uVar377 & 0xfffffffffffff;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar380;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar375;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar381;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar374;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar379;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar373;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar378;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar372;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar383;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar369;
  auVar5 = auVar170 * auVar314 + auVar363 + auVar171 * auVar315;
  uVar372 = auVar5._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar372 & 0xfffffffffffff;
  auVar4 = auVar167 * auVar311 + auVar362 + auVar168 * auVar312 + auVar169 * auVar313 +
           auVar172 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  (r->y).n[2] = uVar383 & 0xfffffffffffff;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar370 & 0xfffffffffffff);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar372 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar364 = auVar173 * ZEXT816(0x1000003d10) + auVar364;
  uVar372 = auVar364._0_8_;
  (r->y).n[3] = uVar372 & 0xfffffffffffff;
  (r->y).n[4] = (uVar372 >> 0x34 | auVar364._8_8_ << 0xc) + (uVar368 & 0xffffffffffff);
  uVar3 = (r->y).n[4];
  uVar365 = (r->y).n[1];
  uVar366 = (r->y).n[2];
  uVar367 = (r->y).n[3];
  (r->y).n[0] = 0x5ffff9ffffe91a - ((r->y).n[0] + (uVar385 & 0xfffffffffffff));
  (r->y).n[1] = 0x5ffffffffffffa - (uVar365 + (uVar387 & 0xfffffffffffff));
  (r->y).n[2] = 0x5ffffffffffffa - (uVar366 + (uVar382 & 0xfffffffffffff));
  (r->y).n[3] = 0x5ffffffffffffa - (uVar367 + (uVar376 & 0xfffffffffffff));
  (r->y).n[4] = 0x5fffffffffffa -
                (uVar3 + (uVar376 >> 0x34 | auVar357._8_8_ << 0xc) + (uVar384 & 0xffffffffffff));
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;

    secp256k1_gej_verify(a);
    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */
    secp256k1_gej_verify(r);
}